

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_revision.cpp
# Opt level: O2

void __thiscall RevisionsFixture_InitNothing_Test::TestBody(RevisionsFixture_InitNothing_Test *this)

{
  revision_number in_ECX;
  pointer *__ptr;
  char *message;
  maybe<unsigned_int,_void> local_58;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  revisions_type actual;
  revisions_type expected;
  
  anon_unknown.dwarf_677a7::RevisionsFixture::expected_revisions
            (&expected,(RevisionsFixture *)0x8,7,in_ECX);
  local_58.valid_ = false;
  local_58._1_3_ = 0;
  local_58.storage_ = (type)0x0;
  std::pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_>::
  pair<pstore::maybe<unsigned_int,_void>,_true>
            ((pair<unsigned_int,_pstore::maybe<unsigned_int,_void>_> *)&gtest_ar,
             &pstore::head_revision,&local_58);
  pstore::diff_dump::update_revisions(&actual,(revisions_type *)&gtest_ar,8);
  testing::internal::
  CmpHelperEQ<std::pair<unsigned_int,pstore::maybe<unsigned_int,void>>,std::pair<unsigned_int,pstore::maybe<unsigned_int,void>>>
            ((internal *)&gtest_ar,"expected","actual",&expected,&actual);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/diff/test_revision.cpp"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58 != (maybe<unsigned_int,_void>)0x0) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F (RevisionsFixture, InitNothing) {
    diff_dump::revisions_type const expected =
        this->expected_revisions (db_head_revision, db_head_revision - 1);
    diff_dump::revisions_type const actual = diff_dump::update_revisions (
        std::make_pair (head_revision, nothing<revision_number> ()), db_head_revision);

    EXPECT_EQ (expected, actual);
}